

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel3
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  bool bVar2;
  cmConditionEvaluator *this_00;
  iterator arg;
  int reducible;
  iterator argP2;
  iterator argP1;
  iterator local_80;
  int local_74;
  iterator local_70;
  iterator local_68;
  string *local_60;
  MessageType *local_58;
  string local_50;
  
  local_60 = errorString;
  local_58 = status;
  do {
    local_74 = 0;
    local_80._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_70._M_node = (_List_node_base *)0x0;
    for (; local_80._M_node != (_List_node_base *)newArgs;
        local_80._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_80._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_68._M_node = local_80._M_node;
      if ((local_80._M_node != (_List_node_base *)newArgs) &&
         (local_68._M_node = (local_80._M_node)->_M_next, local_70._M_node = local_68._M_node,
         local_68._M_node != (_List_node_base *)newArgs)) {
        local_70._M_node = (local_68._M_node)->_M_next;
      }
      iVar1._M_node = local_68._M_node;
      if (local_68._M_node == (_List_node_base *)newArgs) {
        bVar2 = false;
      }
      else {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NOT","");
        bVar2 = IsKeyword(this,&local_50,(cmExpandedCommandArgument *)(local_80._M_node + 1));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar2 != false) {
        this_00 = this;
        bVar2 = GetBooleanValueWithAutoDereference
                          (this,(cmExpandedCommandArgument *)(iVar1._M_node + 1),local_60,local_58,
                           false);
        HandlePredicate(this_00,!bVar2,&local_74,&local_80,newArgs,&local_68,&local_70);
      }
    }
  } while (local_74 != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel3(cmArgumentList &newArgs,
                  std::string &errorString,
                  cmake::MessageType &status)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      IncrementArguments(newArgs,argP1,argP2);
      if (argP1 != newArgs.end() && IsKeyword("NOT", *arg))
        {
        bool rhs = this->GetBooleanValueWithAutoDereference(*argP1,
                                                      errorString,
                                                      status);
        this->HandlePredicate(!rhs, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}